

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::get_training_timesteps(search_private *priv,v_array<unsigned_long> *timesteps)

{
  bool bVar1;
  size_t sVar2;
  pair<float,_unsigned_long> *ppVar3;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *this;
  pair<COST_SENSITIVE::wclass_&,_bool> **pppVar4;
  ulong uVar5;
  v_array<unsigned_long> *in_RSI;
  long in_RDI;
  float fVar6;
  size_t t_2;
  size_t t_1;
  pair<COST_SENSITIVE::wclass_&,_bool> wcq;
  pair<COST_SENSITIVE::wclass_&,_bool> *__end5;
  pair<COST_SENSITIVE::wclass_&,_bool> *__begin5;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *__range5;
  uint32_t count;
  size_t t;
  size_t i;
  unsigned_long *in_stack_ffffffffffffff38;
  v_array<unsigned_long> *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  unsigned_long *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  float local_94;
  size_t *in_stack_ffffffffffffff98;
  size_t *in_stack_ffffffffffffffa0;
  pair<COST_SENSITIVE::wclass_&,_bool> *local_40;
  uint local_2c;
  ulong local_28;
  ulong local_18;
  
  v_array<unsigned_long>::clear(in_stack_ffffffffffffff40);
  if (-1.0 < *(float *)(in_RDI + 0x2a0)) {
    if (0.0 < *(float *)(in_RDI + 0x2a0)) {
      if (1.0 < *(float *)(in_RDI + 0x2a0) || *(float *)(in_RDI + 0x2a0) == 1.0) {
        while( true ) {
          sVar2 = v_array<unsigned_long>::size(in_RSI);
          uVar5 = (ulong)*(float *)(in_RDI + 0x2a0);
          in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 & 0xffffff;
          if (sVar2 < (uVar5 | (long)(*(float *)(in_RDI + 0x2a0) - 9.223372e+18) &
                               (long)uVar5 >> 0x3f)) {
            sVar2 = v_array<unsigned_long>::size(in_RSI);
            in_stack_ffffffffffffff54 =
                 CONCAT13(sVar2 < *(ulong *)(in_RDI + 0xa0),(int3)in_stack_ffffffffffffff54);
          }
          if ((char)(in_stack_ffffffffffffff54 >> 0x18) == '\0') break;
          fVar6 = merand48((uint64_t *)in_stack_ffffffffffffff40);
          in_stack_ffffffffffffff50 = (float)*(ulong *)(in_RDI + 0xa0);
          uVar5 = (ulong)(fVar6 * in_stack_ffffffffffffff50);
          bVar1 = v_array_contains<unsigned_long>
                            (in_RSI,uVar5 | (long)(fVar6 * in_stack_ffffffffffffff50 - 9.223372e+18)
                                            & (long)uVar5 >> 0x3f);
          if (!bVar1) {
            v_array<unsigned_long>::push_back(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          }
        }
        v_array<unsigned_long>::begin(in_RSI);
        v_array<unsigned_long>::end(in_RSI);
        std::sort<unsigned_long*,bool(*)(unsigned_long,unsigned_long)>
                  ((unsigned_long *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58,
                   (_func_bool_unsigned_long_unsigned_long *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
      else {
        for (in_stack_ffffffffffffffa0 = (size_t *)0x0;
            in_stack_ffffffffffffffa0 < *(size_t **)(in_RDI + 0xa0);
            in_stack_ffffffffffffffa0 = (size_t *)((long)in_stack_ffffffffffffffa0 + 1)) {
          fVar6 = merand48((uint64_t *)in_stack_ffffffffffffff40);
          if (fVar6 <= *(float *)(in_RDI + 0x2a0)) {
            v_array<unsigned_long>::push_back(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          }
        }
        sVar2 = v_array<unsigned_long>::size(in_RSI);
        if (sVar2 == 0) {
          fVar6 = merand48((uint64_t *)in_stack_ffffffffffffff40);
          local_94 = (float)*(ulong *)(in_RDI + 0xa0);
          uVar5 = (ulong)(fVar6 * local_94);
          in_stack_ffffffffffffff98 =
               (size_t *)(uVar5 | (long)(fVar6 * local_94 - 9.223372e+18) & (long)uVar5 >> 0x3f);
          v_array<unsigned_long>::push_back(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
      }
    }
    else {
      for (local_28 = 0; local_28 < *(ulong *)(in_RDI + 0xa0); local_28 = local_28 + 1) {
        local_2c = 99;
        if (((*(byte *)(in_RDI + 0x611) & 1) != 0) &&
           (sVar2 = v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::size
                              ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)
                               (in_RDI + 0x5f0)), local_28 < sVar2)) {
          local_2c = 0;
          this = v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::operator[]
                           ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)
                            (in_RDI + 0x5f0),local_28);
          pppVar4 = v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::begin(this);
          local_40 = *pppVar4;
          pppVar4 = v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::end(this);
          while ((local_40 != *pppVar4 &&
                 (((*(ulong *)&local_40->second & 1) == 0 || (local_2c = local_2c + 1, local_2c < 2)
                  )))) {
            local_40 = local_40 + 1;
          }
        }
        if (1 < local_2c) {
          v_array<unsigned_long>::push_back(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
      }
    }
  }
  else {
    for (local_18 = 0;
        sVar2 = v_array<std::pair<float,_unsigned_long>_>::size
                          ((v_array<std::pair<float,_unsigned_long>_> *)(in_RDI + 0x5d0)),
        local_18 < sVar2; local_18 = local_18 + 1) {
      fVar6 = merand48((uint64_t *)in_stack_ffffffffffffff40);
      ppVar3 = v_array<std::pair<float,_unsigned_long>_>::operator[]
                         ((v_array<std::pair<float,_unsigned_long>_> *)(in_RDI + 0x5d0),local_18);
      if (ppVar3->first <= fVar6 && fVar6 != ppVar3->first) {
        v_array<std::pair<float,_unsigned_long>_>::operator[]
                  ((v_array<std::pair<float,_unsigned_long>_> *)(in_RDI + 0x5d0),local_18);
        v_array<unsigned_long>::push_back(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
    }
  }
  if ((*(byte *)(in_RDI + 0x88) & 1) == 0) {
    v_array<unsigned_long>::begin(in_RSI);
    v_array<unsigned_long>::end(in_RSI);
    hoopla_permute(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void get_training_timesteps(search_private& priv, v_array<size_t>& timesteps)
{
  timesteps.clear();

  // if there's active learning, we need to
  if (priv.subsample_timesteps <= -1)
  {
    for (size_t i = 0; i < priv.active_uncertainty.size(); i++)
      if (merand48(priv.all->random_state) > priv.active_uncertainty[i].first)
        timesteps.push_back(priv.active_uncertainty[i].second - 1);
    /*
    float k = (float)priv.total_examples_generated;
    priv.ec_seq[t]->revert_weight = priv.all->loss->getRevertingWeight(priv.all->sd, priv.ec_seq[t].pred.scalar,
    priv.all->eta / powf(k, priv.all->power_t)); float importance = query_decision(active_str, *priv.ec_seq[t], k); if
    (importance > 0.) timesteps.push_back(pair<size_t,size_t>(0,t));
    */
  }
  // if there's no subsampling to do, just return [0,T)
  else if (priv.subsample_timesteps <= 0)
    for (size_t t = 0; t < priv.T; t++)
    {
      uint32_t count = 99;
      if (priv.active_csoaa && (t < priv.active_known.size()))
      {
        count = 0;
        for (pair<CS::wclass&, bool> wcq : priv.active_known[t])
          if (wcq.second)
          {
            count++;
            if (count > 1)
              break;
          }
      }
      if (count > 1)
        timesteps.push_back(t);
    }

  // if subsample in (0,1) then pick steps with that probability, but ensuring there's at least one!
  else if (priv.subsample_timesteps < 1)
  {
    for (size_t t = 0; t < priv.T; t++)
      if (merand48(priv.all->random_state) <= priv.subsample_timesteps)
        timesteps.push_back(t);

    if (timesteps.size() == 0)  // ensure at least one
      timesteps.push_back((size_t)(merand48(priv.all->random_state) * priv.T));
  }

  // finally, if subsample >= 1, then pick (int) that many uniformly at random without replacement; could use an LFSR
  // but why? :P
  else
  {
    while ((timesteps.size() < (size_t)priv.subsample_timesteps) && (timesteps.size() < priv.T))
    {
      size_t t = (size_t)(merand48(priv.all->random_state) * (float)priv.T);
      if (!v_array_contains(timesteps, t))
        timesteps.push_back(t);
    }
    std::sort(timesteps.begin(), timesteps.end(), cmp_size_t);
  }

  if (!priv.linear_ordering)
    hoopla_permute(timesteps.begin(), timesteps.end());
}